

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O2

Value * __thiscall xmrig::JsonReader::getValue(JsonReader *this,char *key)

{
  Value *pVVar1;
  
  pVVar1 = Json::getValue(this->m_obj,key);
  return pVVar1;
}

Assistant:

inline const rapidjson::Value &getValue(const char *key) const override                          { return Json::getValue(m_obj, key); }